

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

int32_t ucal_getDSTSavings_63(UChar *zoneID,UErrorCode *ec)

{
  UBool UVar1;
  long *local_58;
  int local_44;
  undefined1 local_40 [4];
  int32_t dst;
  int32_t raw;
  int32_t i;
  UDate d;
  SimpleTimeZone *stz;
  TimeZone *zone;
  UErrorCode *pUStack_18;
  int32_t result;
  UErrorCode *ec_local;
  UChar *zoneID_local;
  
  zone._4_4_ = 0;
  pUStack_18 = ec;
  ec_local = (UErrorCode *)zoneID;
  stz = (SimpleTimeZone *)_createTimeZone(zoneID,-1,ec);
  UVar1 = U_SUCCESS(*pUStack_18);
  if (UVar1 != '\0') {
    if (stz == (SimpleTimeZone *)0x0) {
      local_58 = (long *)0x0;
    }
    else {
      local_58 = (long *)__dynamic_cast(stz,&icu_63::TimeZone::typeinfo,
                                        &icu_63::SimpleTimeZone::typeinfo,0);
    }
    d = (UDate)local_58;
    if (local_58 == (long *)0x0) {
      _raw = icu_63::Calendar::getNow();
      for (dst = 0; dst < 0x35; dst = dst + 1) {
        (*(stz->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[6])
                  (_raw,stz,0,local_40,&local_44,pUStack_18);
        UVar1 = U_FAILURE(*pUStack_18);
        if (UVar1 != '\0') break;
        if (local_44 != 0) {
          zone._4_4_ = local_44;
          break;
        }
        _raw = _raw + 604800000.0;
      }
    }
    else {
      zone._4_4_ = (**(code **)(*local_58 + 0x68))();
    }
  }
  if (stz != (SimpleTimeZone *)0x0) {
    (*(stz->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
  }
  return zone._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getDSTSavings(const UChar* zoneID, UErrorCode* ec) {
    int32_t result = 0;
    TimeZone* zone = _createTimeZone(zoneID, -1, ec);
    if (U_SUCCESS(*ec)) {
        SimpleTimeZone* stz = dynamic_cast<SimpleTimeZone*>(zone);
        if (stz != NULL) {
            result = stz->getDSTSavings();
        } else {
            // Since there is no getDSTSavings on TimeZone, we use a
            // heuristic: Starting with the current time, march
            // forwards for one year, looking for DST savings.
            // Stepping by weeks is sufficient.
            UDate d = Calendar::getNow();
            for (int32_t i=0; i<53; ++i, d+=U_MILLIS_PER_DAY*7.0) {
                int32_t raw, dst;
                zone->getOffset(d, FALSE, raw, dst, *ec);
                if (U_FAILURE(*ec)) {
                    break;
                } else if (dst != 0) {
                    result = dst;
                    break;
                }
            }
        }
    }
    delete zone;
    return result;
}